

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int tx_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,wally_tx **output)

{
  ulong uVar1;
  size_t *psVar2;
  uint32_t uVar3;
  wally_tx *pwVar4;
  uint64_t uVar5;
  wally_tx **ppwVar6;
  leint32_t tmp_1;
  int iVar7;
  undefined8 in_RAX;
  undefined7 uVar13;
  size_t sVar8;
  size_t sVar9;
  byte *pbVar10;
  ulong uVar11;
  size_t sVar12;
  uint32_t sequence;
  byte *pbVar14;
  uchar *puVar15;
  byte bVar16;
  undefined1 free_parent;
  wally_tx_witness_stack **output_00;
  size_t sVar17;
  uint32_t *nonce;
  uchar *entropy;
  uint64_t *bytes_00;
  uchar *puVar18;
  uint64_t *bytes_01;
  long lVar19;
  ulong uVar20;
  uint32_t *puVar21;
  byte *pbVar22;
  uint32_t *puVar23;
  uchar *puVar24;
  bool bVar25;
  uint64_t num_witnesses;
  uint64_t tmp;
  uint64_t issuance_amount_len;
  uint64_t inflation_keys_len;
  uint64_t nonce_len;
  ulong local_b0;
  size_t local_a8;
  uint64_t local_a0;
  undefined4 local_94;
  size_t local_90;
  wally_tx *local_88;
  uint64_t local_80;
  uint32_t *local_78;
  uint64_t local_70;
  size_t local_68;
  uint64_t local_60;
  uint local_54;
  size_t local_50;
  wally_tx **local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (output == (wally_tx **)0x0) {
    return -2;
  }
  *output = (wally_tx *)0x0;
  uVar13 = (undefined7)((ulong)in_RAX >> 8);
  if (0xf < flags || (bytes_len < 6 || bytes == (uchar *)0x0)) {
    return -2;
  }
  if ((flags & 2) == 0) {
    pbVar14 = bytes + 4;
    if ((flags < 8) && (*pbVar14 == 0)) {
      if (bytes[5] != '\x01') {
        return -2;
      }
      pbVar14 = bytes + 6;
      local_94 = (undefined4)CONCAT71(uVar13,1);
    }
    else {
      local_94 = 0;
    }
  }
  else {
    if (7 < flags) {
      return -2;
    }
    pbVar14 = bytes + 5;
    local_94 = (undefined4)CONCAT71(uVar13,bytes[4] != '\0');
  }
  pbVar22 = bytes + bytes_len;
  if (pbVar22 < pbVar14) {
    return -2;
  }
  local_48 = output;
  sVar8 = varint_length_from_bytes(pbVar14);
  if (pbVar22 < pbVar14 + sVar8) {
    return -2;
  }
  sVar8 = varint_from_bytes(pbVar14,&local_a8);
  pbVar14 = pbVar14 + sVar8;
  local_90 = local_a8;
  if (local_a8 != 0) {
    sVar8 = 0;
    do {
      if (pbVar22 < pbVar14) {
        return -2;
      }
      pbVar10 = pbVar14 + 0x24;
      if (pbVar22 < pbVar10) {
        return -2;
      }
      bVar25 = false;
      if (((((flags & 2) != 0) && (*(int *)(pbVar14 + 0x20) < 0)) &&
          (bVar25 = true, *(int *)(pbVar14 + 0x20) == -1)) && (*pbVar14 == 0)) {
        uVar20 = 0;
        do {
          uVar11 = uVar20;
          if (uVar11 == 0x1f) break;
          uVar20 = uVar11 + 1;
        } while (pbVar14[uVar11 + 1] == 0);
        bVar25 = uVar11 < 0x1f;
      }
      sVar9 = varint_length_from_bytes(pbVar10);
      if (pbVar22 < pbVar10 + sVar9) {
        return -2;
      }
      sVar9 = varint_from_bytes(pbVar10,&local_a8);
      if (pbVar22 < pbVar10 + sVar9) {
        return -2;
      }
      pbVar10 = pbVar10 + sVar9 + local_a8;
      if (pbVar22 < pbVar10) {
        return -2;
      }
      pbVar14 = pbVar10 + 4;
      if (pbVar22 < pbVar14) {
        return -2;
      }
      if (bVar25) {
        if (pbVar22 < pbVar10 + 0x44) {
          return -2;
        }
        bVar16 = pbVar10[0x44];
        if (bVar16 - 8 < 2) {
          pbVar10 = pbVar10 + 0x65;
        }
        else if (bVar16 == 1) {
          pbVar10 = pbVar10 + 0x4d;
        }
        else {
          if (bVar16 != 0) {
            return -2;
          }
          pbVar10 = pbVar10 + 0x45;
        }
        if (pbVar22 < pbVar10) {
          return -2;
        }
        bVar16 = *pbVar10;
        if (bVar16 - 8 < 2) {
          pbVar14 = pbVar10 + 0x21;
        }
        else if (bVar16 == 1) {
          pbVar14 = pbVar10 + 9;
        }
        else {
          if (bVar16 != 0) {
            return -2;
          }
          pbVar14 = pbVar10 + 1;
        }
        if (pbVar22 < pbVar14) {
          return -2;
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_90);
  }
  if (pbVar22 < pbVar14) {
    return -2;
  }
  sVar8 = varint_length_from_bytes(pbVar14);
  if (pbVar22 < pbVar14 + sVar8) {
    return -2;
  }
  sVar8 = varint_from_bytes(pbVar14,&local_a8);
  pbVar14 = pbVar14 + sVar8;
  local_68 = local_a8;
  if (local_a8 != 0) {
    sVar8 = local_a8;
    do {
      if ((flags & 2) == 0) {
        if (pbVar22 < pbVar14) {
          return -2;
        }
        pbVar14 = pbVar14 + 8;
      }
      else {
        bVar16 = *pbVar14;
        if ((bVar16 - 10 < 2) || (bVar16 == 1)) {
          if (pbVar22 < pbVar14) {
            return -2;
          }
          pbVar14 = pbVar14 + 0x21;
        }
        else {
          if (bVar16 != 0) {
            return -2;
          }
          if (pbVar22 < pbVar14) {
            return -2;
          }
          pbVar14 = pbVar14 + 1;
        }
        if (pbVar22 < pbVar14) {
          return -2;
        }
        bVar16 = *pbVar14;
        if (bVar16 - 8 < 2) {
          pbVar14 = pbVar14 + 0x21;
        }
        else if (bVar16 == 1) {
          pbVar14 = pbVar14 + 9;
        }
        else {
          if (bVar16 != 0) {
            return -2;
          }
          pbVar14 = pbVar14 + 1;
        }
        if (pbVar22 < pbVar14) {
          return -2;
        }
        bVar16 = *pbVar14;
        if ((bVar16 - 2 < 2) || (bVar16 == 1)) {
          pbVar14 = pbVar14 + 0x21;
        }
        else {
          if (bVar16 != 0) {
            return -2;
          }
          pbVar14 = pbVar14 + 1;
        }
      }
      if (pbVar22 < pbVar14) {
        return -2;
      }
      sVar9 = varint_length_from_bytes(pbVar14);
      if (pbVar22 < pbVar14 + sVar9) {
        return -2;
      }
      sVar9 = varint_from_bytes(pbVar14,&local_a8);
      if (pbVar22 < pbVar14 + sVar9) {
        return -2;
      }
      pbVar14 = pbVar14 + sVar9 + local_a8;
      if (pbVar22 < pbVar14) {
        return -2;
      }
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
  }
  local_54 = (flags & 2) >> 1;
  bVar16 = (byte)local_94 ^ 1;
  if (((char)local_54 == '\0' && bVar16 == 0) && local_90 != 0) {
    sVar8 = 0;
    do {
      if (pbVar22 < pbVar14) {
        return -2;
      }
      sVar9 = varint_length_from_bytes(pbVar14);
      if (pbVar22 < pbVar14 + sVar9) {
        return -2;
      }
      sVar9 = varint_from_bytes(pbVar14,&local_b0);
      pbVar14 = pbVar14 + sVar9;
      if (local_b0 != 0) {
        uVar20 = 0;
        do {
          if (pbVar22 < pbVar14) {
            return -2;
          }
          sVar9 = varint_length_from_bytes(pbVar14);
          if (pbVar22 < pbVar14 + sVar9) {
            return -2;
          }
          sVar9 = varint_from_bytes(pbVar14,&local_a8);
          if (pbVar22 < pbVar14 + sVar9) {
            return -2;
          }
          pbVar14 = pbVar14 + sVar9 + local_a8;
          if (pbVar22 < pbVar14) {
            return -2;
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 < local_b0);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_90);
  }
  if (pbVar22 < pbVar14) {
    return -2;
  }
  pbVar14 = pbVar14 + 4;
  if (pbVar22 < pbVar14) {
    return -2;
  }
  if ((flags & 2) != 0 && bVar16 == 0) {
    if (local_90 != 0) {
      sVar8 = 0;
      do {
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar9 = varint_length_from_bytes(pbVar14);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        sVar9 = varint_from_bytes(pbVar14,&local_a8);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        pbVar14 = pbVar14 + sVar9 + local_a8;
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar9 = varint_length_from_bytes(pbVar14);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        sVar9 = varint_from_bytes(pbVar14,&local_a8);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        pbVar14 = pbVar14 + sVar9 + local_a8;
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar9 = varint_length_from_bytes(pbVar14);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        sVar9 = varint_from_bytes(pbVar14,&local_b0);
        pbVar14 = pbVar14 + sVar9;
        if (local_b0 != 0) {
          uVar20 = 0;
          do {
            if (pbVar22 < pbVar14) {
              return -2;
            }
            sVar9 = varint_length_from_bytes(pbVar14);
            if (pbVar22 < pbVar14 + sVar9) {
              return -2;
            }
            sVar9 = varint_from_bytes(pbVar14,&local_a8);
            if (pbVar22 < pbVar14 + sVar9) {
              return -2;
            }
            pbVar14 = pbVar14 + sVar9 + local_a8;
            if (pbVar22 < pbVar14) {
              return -2;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < local_b0);
        }
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar9 = varint_length_from_bytes(pbVar14);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        sVar9 = varint_from_bytes(pbVar14,&local_b0);
        pbVar14 = pbVar14 + sVar9;
        if (local_b0 != 0) {
          uVar20 = 0;
          do {
            if (pbVar22 < pbVar14) {
              return -2;
            }
            sVar9 = varint_length_from_bytes(pbVar14);
            if (pbVar22 < pbVar14 + sVar9) {
              return -2;
            }
            sVar9 = varint_from_bytes(pbVar14,&local_a8);
            if (pbVar22 < pbVar14 + sVar9) {
              return -2;
            }
            pbVar14 = pbVar14 + sVar9 + local_a8;
            if (pbVar22 < pbVar14) {
              return -2;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < local_b0);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != local_90);
    }
    if (local_68 != 0) {
      sVar8 = local_68;
      do {
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar9 = varint_length_from_bytes(pbVar14);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        sVar9 = varint_from_bytes(pbVar14,&local_a8);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        pbVar14 = pbVar14 + sVar9 + local_a8;
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar9 = varint_length_from_bytes(pbVar14);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        sVar9 = varint_from_bytes(pbVar14,&local_a8);
        if (pbVar22 < pbVar14 + sVar9) {
          return -2;
        }
        pbVar14 = pbVar14 + sVar9 + local_a8;
        if (pbVar22 < pbVar14) {
          return -2;
        }
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
  }
  ppwVar6 = local_48;
  sVar8 = local_90;
  iVar7 = wally_tx_init_alloc(0,0,local_90,local_68,local_48);
  if (iVar7 != 0) {
    return iVar7;
  }
  local_88 = *ppwVar6;
  local_88->version = *(uint32_t *)bytes;
  lVar19 = 5;
  if ((flags & 2) == 0) {
    lVar19 = (ulong)(byte)local_94 * 2 + 4;
  }
  puVar15 = bytes + lVar19;
  sVar9 = varint_from_bytes(puVar15,&local_a8);
  puVar21 = (uint32_t *)(puVar15 + sVar9);
  if (sVar8 != 0) {
    sVar8 = 0;
    do {
      local_a0 = 0;
      local_80 = 0;
      uVar3 = puVar21[8];
      sVar9 = varint_from_bytes((uchar *)(puVar21 + 9),&local_b0);
      uVar20 = local_b0;
      puVar15 = (uchar *)((long)puVar21 + sVar9 + 0x24);
      puVar23 = (uint32_t *)((long)(puVar15 + local_b0) + 4);
      sequence = *(uint32_t *)(puVar15 + local_b0);
      local_50 = CONCAT44(local_50._4_4_,uVar3);
      if (((flags & 2) == 0) || (-1 < (int)uVar3)) {
        nonce = (uint32_t *)0x0;
        entropy = (uchar *)0x0;
        puVar24 = (uchar *)0x0;
        puVar18 = (uchar *)0x0;
        local_78 = puVar23;
      }
      else {
        local_70 = CONCAT44(local_70._4_4_,sequence);
        if ((uVar3 == 0xffffffff) && ((char)*puVar21 == '\0')) {
          uVar11 = 0xffffffffffffffff;
          do {
            if (uVar11 == 0x1e) goto LAB_003f158a;
            uVar1 = uVar11 + 1;
            lVar19 = uVar11 + 2;
            uVar11 = uVar1;
          } while (*(char *)((long)puVar21 + lVar19) == '\0');
          local_78 = puVar23;
          if (uVar1 < 0x1f) goto LAB_003f13e7;
LAB_003f158a:
          nonce = (uint32_t *)0x0;
          entropy = (uchar *)0x0;
          puVar24 = (uchar *)0x0;
          puVar18 = (uchar *)0x0;
          local_78 = puVar23;
        }
        else {
LAB_003f13e7:
          local_40 = puVar15 + local_b0 + 0x24;
          puVar24 = puVar15 + local_b0 + 0x44;
          local_38 = puVar15;
          sVar9 = confidential_value_varint_from_bytes(puVar24,&local_a0);
          puVar18 = puVar15 + sVar9 + uVar20 + 0x44;
          sVar9 = confidential_value_varint_from_bytes(puVar18,&local_80);
          nonce = puVar23;
          puVar15 = local_38;
          entropy = local_40;
          local_78 = (uint32_t *)(puVar18 + sVar9);
        }
        sequence = (uint32_t)local_70;
      }
      pwVar4 = local_88;
      if (local_b0 == 0) {
        puVar15 = (uchar *)0x0;
      }
      if (local_a0 == 0) {
        puVar24 = (uchar *)0x0;
      }
      if (local_80 == 0) {
        puVar18 = (uchar *)0x0;
      }
      free_parent = 0x20;
      iVar7 = tx_elements_input_init
                        ((uchar *)puVar21,0x20,(uint32_t)local_50,sequence,puVar15,local_b0,
                         (wally_tx_witness_stack *)0x0,(uchar *)nonce,
                         (ulong)(nonce != (uint32_t *)0x0) << 5,entropy,
                         (ulong)(entropy != (uchar *)0x0) << 5,puVar24,local_a0,puVar18,local_80,
                         (uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,
                         local_88->inputs + sVar8,SUB41(local_54,0));
      if (iVar7 != 0) goto LAB_003f1d2f;
      pwVar4->num_inputs = pwVar4->num_inputs + 1;
      sVar8 = sVar8 + 1;
      puVar21 = local_78;
    } while (sVar8 != local_90);
  }
  sVar8 = varint_from_bytes((uchar *)puVar21,&local_a8);
  pwVar4 = local_88;
  bytes_00 = (uint64_t *)(sVar8 + (long)puVar21);
  if (local_68 != 0) {
    puVar21 = (uint32_t *)0x0;
    sVar8 = local_68;
    do {
      local_a0 = 0;
      local_80 = 0;
      local_60 = 0;
      local_78 = puVar21;
      local_50 = sVar8;
      if ((flags & 2) == 0) {
        local_70 = *bytes_00;
        bytes_01 = bytes_00 + 1;
        bytes_00 = (uint64_t *)0x0;
        puVar15 = (uchar *)0x0;
        puVar24 = (uchar *)0x0;
      }
      else {
        sVar8 = confidential_asset_varint_from_bytes((uchar *)bytes_00,&local_a0);
        puVar15 = (uchar *)(sVar8 + (long)bytes_00);
        sVar8 = confidential_value_varint_from_bytes(puVar15,&local_80);
        puVar24 = puVar15 + sVar8;
        sVar8 = confidential_nonce_varint_from_bytes(puVar24,&local_60);
        bytes_01 = (uint64_t *)(puVar24 + sVar8);
        local_70 = 0xffffffffffffffff;
      }
      sVar8 = varint_from_bytes((uchar *)bytes_01,&local_b0);
      puVar21 = local_78;
      uVar20 = local_b0;
      puVar18 = (uchar *)(sVar8 + (long)bytes_01);
      if (local_b0 == 0) {
        puVar18 = (uchar *)0x0;
      }
      if (local_a0 == 0) {
        bytes_00 = (uint64_t *)0x0;
      }
      if (local_80 == 0) {
        puVar15 = (uchar *)0x0;
      }
      if (local_60 == 0) {
        puVar24 = (uchar *)0x0;
      }
      iVar7 = tx_elements_output_init
                        (local_70,puVar18,local_b0,(uchar *)bytes_00,local_a0,puVar15,local_80,
                         puVar24,local_60,(uchar *)0x0,0,(uchar *)0x0,0,
                         (wally_tx_output *)((long)&pwVar4->outputs->satoshi + (long)local_78),
                         SUB41(local_54,0));
      free_parent = SUB81(puVar18,0);
      if (iVar7 != 0) goto LAB_003f1d2f;
      psVar2 = &pwVar4->num_outputs;
      *psVar2 = *psVar2 + 1;
      bytes_00 = (uint64_t *)((uchar *)(sVar8 + (long)bytes_01) + uVar20);
      puVar21 = puVar21 + 0x1c;
      sVar8 = local_50 - 1;
    } while (sVar8 != 0);
  }
  if ((((flags & 2) == 0 && local_90 != 0) & (byte)local_94) == 1) {
    sVar8 = 0;
    do {
      sVar9 = varint_from_bytes((uchar *)bytes_00,&local_b0);
      bytes_00 = (uint64_t *)(sVar9 + (long)bytes_00);
      if (local_b0 != 0) {
        output_00 = &local_88->inputs[sVar8].witness;
        iVar7 = wally_tx_witness_stack_init_alloc(local_b0,output_00);
        pwVar4 = local_88;
        free_parent = SUB81(output_00,0);
        if (iVar7 != 0) goto LAB_003f1d2f;
        if (local_b0 != 0) {
          sVar9 = 0;
          do {
            sVar12 = varint_from_bytes((uchar *)bytes_00,&local_a0);
            sVar17 = sVar9;
            iVar7 = wally_tx_witness_stack_set
                              (pwVar4->inputs[sVar8].witness,sVar9,
                               (uchar *)(sVar12 + (long)bytes_00),local_a0);
            free_parent = (undefined1)sVar17;
            if (iVar7 != 0) goto LAB_003f1d2f;
            bytes_00 = (uint64_t *)((uchar *)(sVar12 + (long)bytes_00) + local_a0);
            sVar9 = sVar9 + 1;
          } while (sVar9 < local_b0);
        }
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != local_90);
  }
  local_88->locktime = (uint32_t)*bytes_00;
  if ((flags & 2) == 0 || bVar16 != 0) {
    return 0;
  }
  puVar21 = (uint32_t *)((long)bytes_00 + 4);
  if (local_90 != 0) {
    lVar19 = 0;
    do {
      sVar8 = varint_from_bytes((uchar *)puVar21,&local_a0);
      puVar15 = (uchar *)((long)puVar21 + sVar8);
      puVar24 = puVar15 + local_a0;
      sVar8 = varint_from_bytes(puVar24,&local_80);
      uVar5 = local_80;
      puVar24 = puVar24 + sVar8;
      if (local_a0 == 0) {
        puVar15 = (uchar *)0x0;
      }
      puVar18 = puVar24;
      if (local_80 == 0) {
        puVar18 = (uchar *)0x0;
      }
      iVar7 = tx_elements_input_issuance_proof_init
                        ((wally_tx_input *)(local_88->inputs->txhash + lVar19),puVar15,local_a0,
                         puVar18,local_80);
      free_parent = SUB81(puVar15,0);
      if (iVar7 != 0) goto LAB_003f1d2f;
      puVar24 = puVar24 + uVar5;
      puVar15 = local_88->inputs->blinding_nonce + lVar19 + -9;
      iVar7 = witness_stack_from_bytes(puVar24,(wally_tx_witness_stack **)puVar15,&local_60);
      free_parent = SUB81(puVar15,0);
      if (iVar7 != 0) goto LAB_003f1d2f;
      puVar24 = puVar24 + local_60;
      puVar15 = local_88->inputs->entropy + lVar19 + 0x67;
      iVar7 = witness_stack_from_bytes(puVar24,(wally_tx_witness_stack **)puVar15,&local_60);
      free_parent = SUB81(puVar15,0);
      if (iVar7 != 0) goto LAB_003f1d2f;
      puVar21 = (uint32_t *)(puVar24 + local_60);
      lVar19 = lVar19 + 0xd0;
      local_90 = local_90 - 1;
    } while (local_90 != 0);
  }
  if (local_68 == 0) {
    return 0;
  }
  lVar19 = 0;
  sVar8 = local_68;
  while( true ) {
    sVar9 = varint_from_bytes((uchar *)puVar21,&local_a0);
    puVar15 = (uchar *)((long)puVar21 + sVar9);
    puVar24 = puVar15 + local_a0;
    sVar9 = varint_from_bytes(puVar24,&local_80);
    uVar5 = local_80;
    if (local_a0 == 0) {
      puVar15 = (uchar *)0x0;
    }
    puVar18 = puVar24 + sVar9;
    if (local_80 == 0) {
      puVar18 = (uchar *)0x0;
    }
    iVar7 = tx_elements_output_proof_init
                      ((wally_tx_output *)((long)&local_88->outputs->satoshi + lVar19),puVar15,
                       local_a0,puVar18,local_80);
    free_parent = SUB81(puVar15,0);
    if (iVar7 != 0) break;
    puVar21 = (uint32_t *)(puVar24 + sVar9 + uVar5);
    lVar19 = lVar19 + 0x70;
    sVar8 = sVar8 - 1;
    if (sVar8 == 0) {
      return 0;
    }
  }
LAB_003f1d2f:
  tx_free(local_88,(_Bool)free_parent);
  *local_48 = (wally_tx *)0x0;
  return iVar7;
}

Assistant:

static int tx_from_bytes(const unsigned char *bytes, size_t bytes_len,
                         uint32_t flags, struct wally_tx **output)
{
    const unsigned char *p = bytes;
    const bool is_elements = flags & WALLY_TX_FLAG_USE_ELEMENTS;
    bool expect_witnesses;
    size_t i, j, num_inputs, num_outputs;
    uint64_t tmp, num_witnesses;
    int ret;
    struct wally_tx *result;

    TX_CHECK_OUTPUT;

    if (analyze_tx(bytes, bytes_len, flags, &num_inputs, &num_outputs,
                   &expect_witnesses) != WALLY_OK)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(0, 0, num_inputs, num_outputs, output);
    if (ret != WALLY_OK)
        return ret;
    result = (struct wally_tx *)*output;

    p += uint32_from_le_bytes(p, &result->version);
    if (is_elements)
        p++; /* Skip witness flag */
    else if (expect_witnesses)
        p += 2; /* Skip flag bytes */
    p += varint_from_bytes(p, &tmp);

    for (i = 0; i < num_inputs; ++i) {
        const unsigned char *txhash = p, *script, *nonce = NULL, *entropy = NULL;
        const unsigned char *issuance_amount = NULL, *inflation_keys = NULL;
        uint32_t index, sequence;
        uint64_t script_len, issuance_amount_len = 0, inflation_keys_len = 0;
        p += WALLY_TXHASH_LEN;
        p += uint32_from_le_bytes(p, &index);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        p += uint32_from_le_bytes(p, &sequence);
        if (is_elements && !!(index & WALLY_TX_ISSUANCE_FLAG) && !is_coinbase_bytes(txhash, WALLY_TXHASH_LEN, index)) {
            nonce = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            entropy = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            issuance_amount = p;
            p += confidential_value_varint_from_bytes(p, &issuance_amount_len);
            inflation_keys = p;
            p += confidential_value_varint_from_bytes(p, &inflation_keys_len);
        }
        ret = tx_elements_input_init(txhash, WALLY_TXHASH_LEN, index, sequence,
                                     script_len ? script : NULL, script_len, NULL,
                                     nonce, nonce ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     entropy, entropy ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     issuance_amount_len ? issuance_amount : NULL, issuance_amount_len,
                                     inflation_keys_len ? inflation_keys : NULL, inflation_keys_len,
                                     NULL, 0, NULL, 0, NULL, &result->inputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_inputs += 1;
    }

    p += varint_from_bytes(p, &tmp);
    for (i = 0; i < num_outputs; ++i) {
        const unsigned char *script, *asset = NULL, *value = NULL, *nonce = NULL;
        uint64_t satoshi = -1, script_len, asset_len = 0, value_len = 0, nonce_len = 0;
        if (is_elements) {
            asset = p;
            p += confidential_asset_varint_from_bytes(p, &asset_len);
            value = p;
            p += confidential_value_varint_from_bytes(p, &value_len);
            nonce = p;
            p += confidential_nonce_varint_from_bytes(p, &nonce_len);
        } else
            p += uint64_from_le_bytes(p, &satoshi);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        ret = tx_elements_output_init(satoshi, script_len ? script : NULL, script_len,
                                      asset_len ? asset : NULL, asset_len,
                                      value_len ? value : NULL, value_len,
                                      nonce_len ? nonce : NULL, nonce_len,
                                      NULL, 0, NULL, 0,
                                      &result->outputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_outputs += 1;
    }

    if (expect_witnesses && !is_elements) {
        for (i = 0; i < num_inputs; ++i) {
            p += varint_from_bytes(p, &num_witnesses);
            if (!num_witnesses)
                continue;
            ret = wally_tx_witness_stack_init_alloc(num_witnesses,
                                                    &result->inputs[i].witness);
            if (ret != WALLY_OK)
                goto fail;

            for (j = 0; j < num_witnesses; ++j) {
                uint64_t witness_len;
                p += varint_from_bytes(p, &witness_len);
                ret = wally_tx_witness_stack_set(result->inputs[i].witness, j,
                                                 p, witness_len);
                if (ret != WALLY_OK)
                    goto fail;
                p += witness_len;
            }
        }
    }

    uint32_from_le_bytes(p, &result->locktime);

#ifdef BUILD_ELEMENTS

#define proof_from_bytes(dst, len) \
    p += varint_from_bytes(p, (len)); \
    (dst) = p; \
    p += *(len)

    if (expect_witnesses && is_elements) {
        p += sizeof(uint32_t);
        for (i = 0; i < num_inputs; ++i) {
            const unsigned char *issuance_amount_rangeproof, *inflation_keys_rangeproof;
            uint64_t issuance_amount_rangeproof_len, inflation_keys_rangeproof_len, offset;
            proof_from_bytes(issuance_amount_rangeproof, &issuance_amount_rangeproof_len);
            proof_from_bytes(inflation_keys_rangeproof, &inflation_keys_rangeproof_len);
            ret = tx_elements_input_issuance_proof_init(result->inputs + i,
                                                        issuance_amount_rangeproof_len ? issuance_amount_rangeproof : NULL,
                                                        issuance_amount_rangeproof_len,
                                                        inflation_keys_rangeproof_len ? inflation_keys_rangeproof : NULL,
                                                        inflation_keys_rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
            ret = witness_stack_from_bytes(p, &result->inputs[i].witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
            ret = witness_stack_from_bytes(p, &result->inputs[i].pegin_witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
        }

        for (i = 0; i < num_outputs; ++i) {
            const unsigned char *surjectionproof, *rangeproof;
            uint64_t surjectionproof_len, rangeproof_len;
            proof_from_bytes(surjectionproof, &surjectionproof_len);
            proof_from_bytes(rangeproof, &rangeproof_len);
            ret = tx_elements_output_proof_init(result->outputs + i,
                                                surjectionproof_len ? surjectionproof : NULL,
                                                surjectionproof_len,
                                                rangeproof_len ? rangeproof : NULL,
                                                rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
        }
    }

#undef proof_from_bytes

#endif /* BUILD_ELEMENTS */
    return WALLY_OK;
fail:
    tx_free(result, true);
    *output = NULL;
    return ret;
}